

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

bool opts::Converter<int>::convert(string *val,int *res)

{
  uint uVar1;
  istringstream iss;
  uint auStack_170 [88];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)val,_S_in);
  std::istream::operator>>((istream *)&iss,res);
  uVar1 = *(uint *)((long)auStack_170 + *(long *)(_iss + -0x18));
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return (uVar1 & 7) == 2;
}

Assistant:

static
    bool            convert(const std::string& val, T& res)
    {
        std::istringstream iss(val);
        iss >> res;
        return !iss.fail() && iss.eof();
    }